

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

pair<__gnu_cxx::__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>,_bool>
 pdqsort_detail::
 partition_right<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
           (HighsDomainChange *begin,HighsDomainChange *end)

{
  double dVar1;
  HighsInt HVar2;
  HighsBoundType HVar3;
  HighsInt HVar4;
  HighsBoundType HVar5;
  bool bVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar7;
  undefined8 extraout_RDX_02;
  HighsDomainChange *pHVar8;
  long lVar9;
  HighsDomainChange *pHVar10;
  HighsDomainChange *this;
  pair<__gnu_cxx::__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>,_bool>
  pVar11;
  T pivot;
  
  pivot.boundval = begin->boundval;
  pivot.column = begin->column;
  pivot.boundtype = begin->boundtype;
  lVar9 = 0x10;
  this = begin;
  do {
    this = this + 1;
    bVar6 = HighsDomainChange::operator<(this,&pivot);
    lVar9 = lVar9 + -0x10;
  } while (bVar6);
  uVar7 = extraout_RDX;
  pHVar8 = this;
  if (lVar9 == 0) {
    do {
      pHVar10 = end;
      if (end <= this) break;
      end = end + -1;
      bVar6 = HighsDomainChange::operator<(end,&pivot);
      uVar7 = extraout_RDX_01;
      pHVar10 = end;
    } while (!bVar6);
  }
  else {
    do {
      end = end + -1;
      bVar6 = HighsDomainChange::operator<(end,&pivot);
      uVar7 = extraout_RDX_00;
      pHVar10 = end;
    } while (!bVar6);
  }
  while (pHVar8 < end) {
    dVar1 = pHVar8->boundval;
    HVar4 = pHVar8->column;
    HVar5 = pHVar8->boundtype;
    HVar2 = end->column;
    HVar3 = end->boundtype;
    pHVar8->boundval = end->boundval;
    pHVar8->column = HVar2;
    pHVar8->boundtype = HVar3;
    end->boundval = dVar1;
    end->column = HVar4;
    end->boundtype = HVar5;
    do {
      pHVar8 = pHVar8 + 1;
      bVar6 = HighsDomainChange::operator<(pHVar8,&pivot);
    } while (bVar6);
    do {
      end = end + -1;
      bVar6 = HighsDomainChange::operator<(end,&pivot);
      uVar7 = extraout_RDX_02;
    } while (!bVar6);
  }
  pVar11._9_7_ = (undefined7)((ulong)uVar7 >> 8);
  pVar11.second = pHVar10 <= this;
  HVar2 = pHVar8[-1].column;
  HVar3 = pHVar8[-1].boundtype;
  begin->boundval = pHVar8[-1].boundval;
  begin->column = HVar2;
  begin->boundtype = HVar3;
  pHVar8[-1].boundval = pivot.boundval;
  pHVar8[-1].column = pivot.column;
  pHVar8[-1].boundtype = pivot.boundtype;
  pVar11.first._M_current = pHVar8 + -1;
  return pVar11;
}

Assistant:

inline std::pair<Iter, bool> partition_right(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        
        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));

        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        
        // Keep swapping pairs of elements that are on the wrong side of the pivot. Previously
        // swapped pairs guard the searches, which is why the first iteration is special-cased
        // above.
        while (first < last) {
            std::iter_swap(first, last);
            while (comp(*++first, pivot));
            while (!comp(*--last, pivot));
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }